

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O1

void basisu::etc_block::get_diff_subblock_colors
               (color_rgba *pDst,uint16_t packed_color5,uint32_t table_idx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  
  if (table_idx < 8) {
    lVar7 = (ulong)table_idx * 0x10;
    iVar1 = (packed_color5 >> 2 & 7) + (packed_color5 & 0x1f) * 8;
    uVar4 = packed_color5 >> 2 & 0xf8 | packed_color5 >> 7 & 7;
    uVar5 = packed_color5 >> 7 & 0xf8 | packed_color5 >> 0xc & 7;
    iVar9 = *(int *)(g_etc1_inten_tables + lVar7);
    iVar6 = iVar9 + uVar5;
    iVar8 = iVar9 + uVar4;
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    iVar10 = 0;
    if (iVar6 < 1) {
      iVar6 = iVar10;
    }
    if (0xfe < iVar8) {
      iVar8 = 0xff;
    }
    if (iVar8 < 1) {
      iVar8 = iVar10;
    }
    iVar2 = *(int *)(g_etc1_inten_tables + lVar7 + 4);
    iVar3 = iVar9 + iVar1;
    if (0xfe < iVar9 + iVar1) {
      iVar3 = 0xff;
    }
    (pDst->field_0).m_comps[0] = (uint8_t)iVar6;
    if (iVar3 < 1) {
      iVar3 = iVar10;
    }
    (pDst->field_0).m_comps[1] = (uint8_t)iVar8;
    (pDst->field_0).m_comps[2] = (uint8_t)iVar3;
    iVar8 = iVar2 + iVar1;
    iVar6 = iVar2 + uVar5;
    if (0xfe < (int)(iVar2 + uVar5)) {
      iVar6 = 0xff;
    }
    if (iVar6 < 1) {
      iVar6 = iVar10;
    }
    (pDst->field_0).m_comps[3] = 0xff;
    iVar9 = iVar2 + uVar4;
    if (0xfe < (int)(iVar2 + uVar4)) {
      iVar9 = 0xff;
    }
    pDst[1].field_0.m_comps[0] = (uint8_t)iVar6;
    uVar11 = '\0';
    uVar12 = (uint8_t)iVar9;
    if (iVar9 < 1) {
      uVar12 = uVar11;
    }
    pDst[1].field_0.m_comps[1] = uVar12;
    if (0xfe < iVar8) {
      iVar8 = 0xff;
    }
    uVar12 = (uint8_t)iVar8;
    if (iVar8 < 1) {
      uVar12 = uVar11;
    }
    pDst[1].field_0.m_comps[2] = uVar12;
    pDst[1].field_0.m_comps[3] = 0xff;
    iVar8 = *(int *)(g_etc1_inten_tables + lVar7 + 8);
    iVar6 = iVar8 + uVar5;
    iVar9 = iVar8 + iVar1;
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    if (iVar6 < 1) {
      iVar6 = iVar10;
    }
    iVar10 = iVar8 + uVar4;
    if (0xfe < (int)(iVar8 + uVar4)) {
      iVar10 = 0xff;
    }
    pDst[2].field_0.m_comps[0] = (uint8_t)iVar6;
    uVar12 = (uint8_t)iVar10;
    if (iVar10 < 1) {
      uVar12 = uVar11;
    }
    pDst[2].field_0.m_comps[1] = uVar12;
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    uVar12 = (uint8_t)iVar9;
    if (iVar9 < 1) {
      uVar12 = uVar11;
    }
    pDst[2].field_0.m_comps[2] = uVar12;
    pDst[2].field_0.m_comps[3] = 0xff;
    iVar6 = *(int *)(g_etc1_inten_tables + lVar7 + 0xc);
    iVar9 = uVar5 + iVar6;
    iVar8 = uVar4 + iVar6;
    iVar6 = iVar6 + iVar1;
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    uVar12 = (uint8_t)iVar9;
    if (iVar9 < 1) {
      uVar12 = uVar11;
    }
    pDst[3].field_0.m_comps[0] = uVar12;
    if (0xfe < iVar8) {
      iVar8 = 0xff;
    }
    uVar12 = (uint8_t)iVar8;
    if (iVar8 < 1) {
      uVar12 = uVar11;
    }
    pDst[3].field_0.m_comps[1] = uVar12;
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    uVar12 = (uint8_t)iVar6;
    if (iVar6 < 1) {
      uVar12 = uVar11;
    }
    pDst[3].field_0.m_comps[2] = uVar12;
    pDst[3].field_0.m_comps[3] = 0xff;
    return;
  }
  __assert_fail("table_idx < cETC1IntenModifierValues",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                ,0x217,
                "static void basisu::etc_block::get_diff_subblock_colors(color_rgba *, uint16_t, uint32_t)"
               );
}

Assistant:

void etc_block::get_diff_subblock_colors(color_rgba* pDst, uint16_t packed_color5, uint32_t table_idx)
	{
		assert(table_idx < cETC1IntenModifierValues);
		const int *pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

		uint32_t r, g, b;
		unpack_color5(r, g, b, packed_color5, true);

		const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

		const int y0 = pInten_modifer_table[0];
		pDst[0].set(ir + y0, ig + y0, ib + y0, 255);

		const int y1 = pInten_modifer_table[1];
		pDst[1].set(ir + y1, ig + y1, ib + y1, 255);

		const int y2 = pInten_modifer_table[2];
		pDst[2].set(ir + y2, ig + y2, ib + y2, 255);

		const int y3 = pInten_modifer_table[3];
		pDst[3].set(ir + y3, ig + y3, ib + y3, 255);
	}